

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

int stbtt_GetGlyphShape(stbtt_fontinfo *info,int glyph_index,stbtt_vertex **pvertices)

{
  stbtt_vertex *psVar1;
  byte bVar2;
  byte bVar3;
  short sVar4;
  uchar *puVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  stbtt_int32 cx;
  stbtt_int32 cy;
  ushort uVar10;
  uint uVar11;
  int num_vertices;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  stbtt_vertex *vertices;
  ushort *puVar15;
  size_t sVar16;
  stbtt_vertex *__dest;
  int iVar17;
  int iVar18;
  ulong uVar19;
  short sVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  byte bVar24;
  short sVar25;
  byte bVar26;
  int sx;
  int sy;
  ushort uVar27;
  int iVar28;
  stbtt_int32 sVar29;
  int iVar30;
  stbtt_int32 sVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar38;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar39;
  float fVar40;
  ushort *local_98;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  stbtt_vertex *comp_verts;
  stbtt_vertex **local_40;
  uchar *local_38;
  
  puVar5 = info->data;
  uVar11 = stbtt__GetGlyfOffset(info,glyph_index);
  *pvertices = (stbtt_vertex *)0x0;
  uVar13 = 0;
  if (-1 < (int)uVar11) {
    uVar14 = (ulong)uVar11;
    uVar10 = CONCAT11(puVar5[uVar14],puVar5[uVar14 + 1]);
    local_40 = pvertices;
    if ((short)uVar10 < 1) {
      if (uVar10 == 0xffff) {
        vertices = (stbtt_vertex *)0x0;
        uVar13 = 0;
        puVar15 = (ushort *)(puVar5 + uVar14 + 10);
        do {
          comp_verts = (stbtt_vertex *)0x0;
          bVar24 = *(byte *)((long)puVar15 + 1);
          if ((bVar24 & 2) == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                          ,0x586,
                          "int stbtt_GetGlyphShape(const stbtt_fontinfo *, int, stbtt_vertex **)");
          }
          if ((bVar24 & 1) == 0) {
            iVar17 = (int)(char)puVar15[2];
            iVar21 = (int)((long)((ulong)*(byte *)((long)puVar15 + 5) << 0x38) >> 0x38);
            lVar23 = 6;
          }
          else {
            auVar7._9_7_ = 0;
            auVar7._0_9_ = SUB169(ZEXT116(0) << 0x40,7);
            auVar6._10_6_ = 0;
            auVar6._0_10_ = SUB1610(auVar7 << 0x38,6);
            auVar37._11_5_ = 0;
            auVar37._0_11_ = SUB1611(auVar6 << 0x30,5);
            auVar8._1_12_ = SUB1612(auVar37 << 0x28,4);
            auVar8[0] = (char)puVar15[3];
            auVar8._13_3_ = 0;
            auVar33._1_14_ = SUB1614(auVar8 << 0x18,2);
            auVar33[0] = (char)puVar15[2];
            auVar33[0xf] = 0;
            auVar33 = ZEXT416((uint)*(byte *)((long)puVar15 + 7) << 0x10 |
                              (uint)*(byte *)((long)puVar15 + 5)) | auVar33 << 8;
            iVar17 = (int)auVar33._0_2_;
            iVar21 = (int)auVar33._2_2_;
            lVar23 = 8;
          }
          local_98 = (ushort *)(lVar23 + (long)puVar15);
          if ((bVar24 & 8) == 0) {
            if ((bVar24 & 0x40) != 0) {
              uVar10 = *local_98;
              fVar35 = (float)(int)(short)(local_98[1] << 8 | local_98[1] >> 8) * 6.1035156e-05;
              local_98 = local_98 + 2;
              _local_58 = ZEXT416((uint)((float)(int)(short)(uVar10 << 8 | uVar10 >> 8) *
                                        6.1035156e-05));
              goto LAB_00146d00;
            }
            if ((char)bVar24 < '\0') {
              local_58._0_4_ =
                   (float)(int)CONCAT11((char)*local_98,*(undefined1 *)((long)local_98 + 1)) *
                   6.1035156e-05;
              local_58._4_4_ =
                   (float)(int)((long)((ulong)CONCAT11((char)local_98[2],
                                                       *(undefined1 *)((long)local_98 + 5)) << 0x30)
                               >> 0x30) * 6.1035156e-05;
              register0x00001288 = 0;
              local_78._0_4_ =
                   (float)(int)CONCAT11((char)local_98[1],*(undefined1 *)((long)local_98 + 3)) *
                   6.1035156e-05;
              local_78._4_4_ =
                   (float)(int)((long)((ulong)CONCAT11((char)local_98[3],
                                                       *(undefined1 *)((long)local_98 + 7)) << 0x30)
                               >> 0x30) * 6.1035156e-05;
              _fStack_70 = 0;
              local_98 = local_98 + 4;
            }
            else {
              _local_58 = ZEXT812(0x3f800000);
              fStack_4c = 0.0;
              _local_78 = ZEXT816(0x3f80000000000000);
            }
          }
          else {
            fVar35 = (float)(int)(short)(*local_98 << 8 | *local_98 >> 8) * 6.1035156e-05;
            local_98 = local_98 + 1;
            register0x00001244 = SUB1612((undefined1  [16])0x0,4);
            local_58._0_4_ = fVar35;
LAB_00146d00:
            _local_78 = ZEXT416((uint)fVar35) << 0x20;
          }
          uVar11 = stbtt_GetGlyphShape(info,(uint)(ushort)(puVar15[1] << 8 | puVar15[1] >> 8),
                                       &comp_verts);
          psVar1 = comp_verts;
          if (0 < (int)uVar11) {
            auVar32._0_4_ = (float)local_78._0_4_ * (float)local_78._0_4_;
            auVar32._4_4_ = (float)local_78._4_4_ * (float)local_78._4_4_;
            auVar32._8_4_ = fStack_70 * fStack_70;
            auVar32._12_4_ = fStack_6c * fStack_6c;
            auVar34._0_4_ = (float)local_58._0_4_ * (float)local_58._0_4_ + auVar32._0_4_;
            auVar34._4_4_ = (float)local_58._4_4_ * (float)local_58._4_4_ + auVar32._4_4_;
            auVar34._8_4_ = fStack_50 * fStack_50 + auVar32._8_4_;
            auVar34._12_4_ = fStack_4c * fStack_4c + auVar32._12_4_;
            auVar33 = sqrtps(auVar32,auVar34);
            sVar16 = 0;
            do {
              fVar35 = (float)(int)*(short *)((long)&comp_verts->x + sVar16);
              fVar38 = (float)(int)((long)((ulong)*(ushort *)((long)&comp_verts->cx + sVar16) <<
                                          0x30) >> 0x30);
              fVar39 = (float)(int)*(short *)((long)&comp_verts->y + sVar16);
              fVar40 = (float)(int)((long)((ulong)*(ushort *)((long)&comp_verts->cy + sVar16) <<
                                          0x30) >> 0x30);
              auVar36._0_4_ =
                   (int)((fVar39 * (float)local_58._4_4_ + fVar35 * (float)local_58._0_4_ +
                         (float)iVar17) * auVar33._0_4_);
              auVar36._4_4_ =
                   (int)((fVar39 * (float)local_78._4_4_ + fVar35 * (float)local_78._0_4_ +
                         (float)iVar21) * auVar33._4_4_);
              auVar36._8_4_ =
                   (int)((fVar40 * (float)local_58._4_4_ + fVar38 * (float)local_58._0_4_ +
                         (float)iVar17) * auVar33._0_4_);
              auVar36._12_4_ =
                   (int)((fVar40 * (float)local_78._4_4_ + fVar38 * (float)local_78._0_4_ +
                         (float)iVar21) * auVar33._4_4_);
              auVar37 = packssdw(auVar36,auVar36);
              *(long *)((long)&comp_verts->x + sVar16) = auVar37._0_8_;
              sVar16 = sVar16 + 10;
            } while ((ulong)uVar11 * 10 != sVar16);
            __dest = (stbtt_vertex *)ImGui::MemAlloc((ulong)(uVar11 + uVar13) * 10);
            if (__dest == (stbtt_vertex *)0x0) {
              if (vertices != (stbtt_vertex *)0x0) {
                ImGui::MemFree(vertices);
              }
              ImGui::MemFree(psVar1);
              return 0;
            }
            if (0 < (int)uVar13) {
              memcpy(__dest,vertices,(ulong)uVar13 * 10);
            }
            memcpy(__dest + uVar13,psVar1,(ulong)uVar11 * 10);
            if (vertices != (stbtt_vertex *)0x0) {
              ImGui::MemFree(vertices);
            }
            ImGui::MemFree(psVar1);
            vertices = __dest;
            uVar13 = uVar11 + uVar13;
          }
          puVar15 = local_98;
        } while ((bVar24 & 0x20) != 0);
      }
      else {
        if ((short)((ushort)puVar5[uVar14] << 8) < 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                        ,0x5bb,
                        "int stbtt_GetGlyphShape(const stbtt_fontinfo *, int, stbtt_vertex **)");
        }
        uVar13 = 0;
        vertices = (stbtt_vertex *)0x0;
      }
    }
    else {
      uVar13 = (uint)uVar10 * 2;
      uVar19 = (ulong)uVar13;
      bVar24 = puVar5[uVar19 + uVar14 + 10];
      bVar26 = puVar5[uVar19 + uVar14 + 0xb];
      bVar2 = puVar5[uVar19 + uVar14 + 8];
      bVar3 = puVar5[uVar19 + uVar14 + 9];
      iVar17 = (uint)bVar3 + (uint)bVar2 * 0x100;
      vertices = (stbtt_vertex *)ImGui::MemAlloc((ulong)((iVar17 + (uint)uVar10 * 2) * 10 + 10));
      if (vertices == (stbtt_vertex *)0x0) {
        return 0;
      }
      local_38 = puVar5 + uVar14 + 10;
      puVar15 = (ushort *)(puVar5 + (ulong)bVar24 * 0x100 + (ulong)bVar26 + uVar19 + uVar14 + 0xc);
      uVar19 = uVar19 & 0xffff;
      local_98._0_4_ = (uint)bVar3;
      iVar21 = (uint)bVar2 * 0x100 + (uint)local_98;
      lVar23 = 0;
      bVar24 = 0;
      bVar26 = 0;
      do {
        if (bVar26 == 0) {
          bVar24 = (byte)*puVar15;
          if ((bVar24 & 8) == 0) {
            puVar15 = (ushort *)((long)puVar15 + 1);
            bVar26 = 0;
          }
          else {
            bVar26 = *(byte *)((long)puVar15 + 1);
            puVar15 = puVar15 + 1;
          }
        }
        else {
          bVar26 = bVar26 - 1;
        }
        (&vertices[uVar19].type)[lVar23] = bVar24;
        lVar23 = lVar23 + 10;
      } while ((ulong)(iVar21 * 2 + 2) * 5 != lVar23);
      lVar23 = 0;
      sVar25 = 0;
      do {
        bVar24 = (&vertices[uVar19].type)[lVar23];
        if ((bVar24 & 2) == 0) {
          if ((bVar24 & 0x10) == 0) {
            sVar25 = sVar25 + (*puVar15 << 8 | *puVar15 >> 8);
            puVar15 = puVar15 + 1;
          }
        }
        else {
          uVar10 = *puVar15;
          puVar15 = (ushort *)((long)puVar15 + 1);
          uVar27 = -(ushort)(byte)uVar10;
          if ((bVar24 & 0x10) != 0) {
            uVar27 = (ushort)(byte)uVar10;
          }
          sVar25 = sVar25 + uVar27;
        }
        *(short *)((long)&vertices[uVar19].x + lVar23) = sVar25;
        lVar23 = lVar23 + 10;
      } while ((ulong)(iVar21 * 2 + 2) * 5 != lVar23);
      lVar23 = 0;
      sVar25 = 0;
      do {
        bVar24 = (&vertices[uVar19].type)[lVar23];
        if ((bVar24 & 4) == 0) {
          if ((bVar24 & 0x20) == 0) {
            sVar25 = sVar25 + (*puVar15 << 8 | *puVar15 >> 8);
            puVar15 = puVar15 + 1;
          }
        }
        else {
          uVar10 = *puVar15;
          puVar15 = (ushort *)((long)puVar15 + 1);
          uVar27 = -(ushort)(byte)uVar10;
          if ((bVar24 & 0x20) != 0) {
            uVar27 = (ushort)(byte)uVar10;
          }
          sVar25 = sVar25 + uVar27;
        }
        *(short *)((long)&vertices[uVar19].y + lVar23) = sVar25;
        lVar23 = lVar23 + 10;
      } while ((ulong)(iVar21 * 2 + 2) * 5 != lVar23);
      num_vertices = 0;
      iVar21 = 0;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_78;
      _local_78 = auVar9 << 0x40;
      iVar12 = 0;
      sVar31 = 0;
      sVar29 = 0;
      sy = 0;
      sx = 0;
      cy = 0;
      cx = 0;
      uVar11 = 0;
      iVar18 = 0;
      do {
        auVar33 = _local_78;
        lVar23 = (long)(int)(uVar13 + iVar21);
        bVar24 = vertices[lVar23].type;
        sVar25 = vertices[lVar23].x;
        sVar4 = vertices[lVar23].y;
        iVar28 = (int)sVar25;
        iVar30 = (int)sVar4;
        if (iVar12 == iVar21) {
          if (iVar21 != 0) {
            num_vertices = stbtt__close_shape(vertices,num_vertices,iVar18,uVar11,sx,sy,sVar29,
                                              sVar31,cx,cy);
          }
          sx = iVar28;
          sy = iVar30;
          if ((bVar24 & 1) == 0) {
            sVar29 = iVar28;
            sVar31 = iVar30;
            if ((vertices[lVar23 + 1].type & 1) == 0) {
              sx = vertices[lVar23 + 1].x + iVar28 >> 1;
              sy = vertices[lVar23 + 1].y + iVar30 >> 1;
            }
            else {
              iVar21 = iVar21 + 1;
              sx = (int)vertices[lVar23 + 1].x;
              sy = (int)vertices[lVar23 + 1].y;
            }
          }
          uVar11 = bVar24 & 1 ^ 1;
          vertices[num_vertices].type = '\x01';
          vertices[num_vertices].x = (short)sx;
          vertices[num_vertices].y = (short)sy;
          vertices[num_vertices].cx = 0;
          vertices[num_vertices].cy = 0;
          iVar18 = local_78._0_4_;
          iVar12 = (ushort)(*(ushort *)(local_38 + (long)iVar18 * 2) << 8 |
                           *(ushort *)(local_38 + (long)iVar18 * 2) >> 8) + 1;
          local_78._4_4_ = 0;
          local_78._0_4_ = iVar18 + 1;
          _fStack_70 = auVar33._8_8_;
          iVar18 = 0;
          iVar22 = iVar21;
          num_vertices = num_vertices + 1;
        }
        else {
          sVar20 = (short)cy;
          iVar22 = iVar21;
          if ((bVar24 & 1) == 0) {
            iVar21 = num_vertices;
            if (iVar18 != 0) {
              iVar21 = num_vertices + 1;
              vertices[num_vertices].type = '\x03';
              vertices[num_vertices].x = (short)((uint)(cx + iVar28) >> 1);
              vertices[num_vertices].y = (short)((uint)(iVar30 + cy) >> 1);
              vertices[num_vertices].cx = (short)cx;
              vertices[num_vertices].cy = sVar20;
            }
            iVar18 = 1;
            num_vertices = iVar21;
            cx = iVar28;
            cy = iVar30;
          }
          else {
            psVar1 = vertices + num_vertices;
            if (iVar18 == 0) {
              psVar1->type = '\x02';
              psVar1->x = sVar25;
              psVar1->y = sVar4;
              psVar1->cx = 0;
              sVar20 = 0;
            }
            else {
              psVar1->type = '\x03';
              psVar1->x = sVar25;
              psVar1->y = sVar4;
              psVar1->cx = (short)cx;
            }
            psVar1->cy = sVar20;
            num_vertices = num_vertices + 1;
            iVar18 = 0;
          }
        }
        iVar21 = iVar22 + 1;
      } while (iVar22 < iVar17);
      uVar13 = stbtt__close_shape(vertices,num_vertices,iVar18,uVar11,sx,sy,sVar29,sVar31,cx,cy);
    }
    *local_40 = vertices;
  }
  return uVar13;
}

Assistant:

STBTT_DEF int stbtt_GetGlyphShape(const stbtt_fontinfo *info, int glyph_index, stbtt_vertex **pvertices)
{
   stbtt_int16 numberOfContours;
   stbtt_uint8 *endPtsOfContours;
   stbtt_uint8 *data = info->data;
   stbtt_vertex *vertices=0;
   int num_vertices=0;
   int g = stbtt__GetGlyfOffset(info, glyph_index);

   *pvertices = NULL;

   if (g < 0) return 0;

   numberOfContours = ttSHORT(data + g);

   if (numberOfContours > 0) {
      stbtt_uint8 flags=0,flagcount;
      stbtt_int32 ins, i,j=0,m,n, next_move, was_off=0, off, start_off=0;
      stbtt_int32 x,y,cx,cy,sx,sy, scx,scy;
      stbtt_uint8 *points;
      endPtsOfContours = (data + g + 10);
      ins = ttUSHORT(data + g + 10 + numberOfContours * 2);
      points = data + g + 10 + numberOfContours * 2 + 2 + ins;

      n = 1+ttUSHORT(endPtsOfContours + numberOfContours*2-2);

      m = n + 2*numberOfContours;  // a loose bound on how many vertices we might need
      vertices = (stbtt_vertex *) STBTT_malloc(m * sizeof(vertices[0]), info->userdata);
      if (vertices == 0)
         return 0;

      next_move = 0;
      flagcount=0;

      // in first pass, we load uninterpreted data into the allocated array
      // above, shifted to the end of the array so we won't overwrite it when
      // we create our final data starting from the front

      off = m - n; // starting offset for uninterpreted data, regardless of how m ends up being calculated

      // first load flags

      for (i=0; i < n; ++i) {
         if (flagcount == 0) {
            flags = *points++;
            if (flags & 8)
               flagcount = *points++;
         } else
            --flagcount;
         vertices[off+i].type = flags;
      }

      // now load x coordinates
      x=0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         if (flags & 2) {
            stbtt_int16 dx = *points++;
            x += (flags & 16) ? dx : -dx; // ???
         } else {
            if (!(flags & 16)) {
               x = x + (stbtt_int16) (points[0]*256 + points[1]);
               points += 2;
            }
         }
         vertices[off+i].x = (stbtt_int16) x;
      }

      // now load y coordinates
      y=0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         if (flags & 4) {
            stbtt_int16 dy = *points++;
            y += (flags & 32) ? dy : -dy; // ???
         } else {
            if (!(flags & 32)) {
               y = y + (stbtt_int16) (points[0]*256 + points[1]);
               points += 2;
            }
         }
         vertices[off+i].y = (stbtt_int16) y;
      }

      // now convert them to our format
      num_vertices=0;
      sx = sy = cx = cy = scx = scy = 0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         x     = (stbtt_int16) vertices[off+i].x;
         y     = (stbtt_int16) vertices[off+i].y;

         if (next_move == i) {
            if (i != 0)
               num_vertices = stbtt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);

            // now start the new one               
            start_off = !(flags & 1);
            if (start_off) {
               // if we start off with an off-curve point, then when we need to find a point on the curve
               // where we can start, and we need to save some state for when we wraparound.
               scx = x;
               scy = y;
               if (!(vertices[off+i+1].type & 1)) {
                  // next point is also a curve point, so interpolate an on-point curve
                  sx = (x + (stbtt_int32) vertices[off+i+1].x) >> 1;
                  sy = (y + (stbtt_int32) vertices[off+i+1].y) >> 1;
               } else {
                  // otherwise just use the next point as our start point
                  sx = (stbtt_int32) vertices[off+i+1].x;
                  sy = (stbtt_int32) vertices[off+i+1].y;
                  ++i; // we're using point i+1 as the starting point, so skip it
               }
            } else {
               sx = x;
               sy = y;
            }
            stbtt_setvertex(&vertices[num_vertices++], STBTT_vmove,sx,sy,0,0);
            was_off = 0;
            next_move = 1 + ttUSHORT(endPtsOfContours+j*2);
            ++j;
         } else {
            if (!(flags & 1)) { // if it's a curve
               if (was_off) // two off-curve control points in a row means interpolate an on-curve midpoint
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, (cx+x)>>1, (cy+y)>>1, cx, cy);
               cx = x;
               cy = y;
               was_off = 1;
            } else {
               if (was_off)
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, x,y, cx, cy);
               else
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vline, x,y,0,0);
               was_off = 0;
            }
         }
      }
      num_vertices = stbtt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);
   } else if (numberOfContours == -1) {
      // Compound shapes.
      int more = 1;
      stbtt_uint8 *comp = data + g + 10;
      num_vertices = 0;
      vertices = 0;
      while (more) {
         stbtt_uint16 flags, gidx;
         int comp_num_verts = 0, i;
         stbtt_vertex *comp_verts = 0, *tmp = 0;
         float mtx[6] = {1,0,0,1,0,0}, m, n;
         
         flags = ttSHORT(comp); comp+=2;
         gidx = ttSHORT(comp); comp+=2;

         if (flags & 2) { // XY values
            if (flags & 1) { // shorts
               mtx[4] = ttSHORT(comp); comp+=2;
               mtx[5] = ttSHORT(comp); comp+=2;
            } else {
               mtx[4] = ttCHAR(comp); comp+=1;
               mtx[5] = ttCHAR(comp); comp+=1;
            }
         }
         else {
            // @TODO handle matching point
            STBTT_assert(0);
         }
         if (flags & (1<<3)) { // WE_HAVE_A_SCALE
            mtx[0] = mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = mtx[2] = 0;
         } else if (flags & (1<<6)) { // WE_HAVE_AN_X_AND_YSCALE
            mtx[0] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = mtx[2] = 0;
            mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
         } else if (flags & (1<<7)) { // WE_HAVE_A_TWO_BY_TWO
            mtx[0] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[2] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
         }
         
         // Find transformation scales.
         m = (float) STBTT_sqrt(mtx[0]*mtx[0] + mtx[1]*mtx[1]);
         n = (float) STBTT_sqrt(mtx[2]*mtx[2] + mtx[3]*mtx[3]);

         // Get indexed glyph.
         comp_num_verts = stbtt_GetGlyphShape(info, gidx, &comp_verts);
         if (comp_num_verts > 0) {
            // Transform vertices.
            for (i = 0; i < comp_num_verts; ++i) {
               stbtt_vertex* v = &comp_verts[i];
               stbtt_vertex_type x,y;
               x=v->x; y=v->y;
               v->x = (stbtt_vertex_type)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
               v->y = (stbtt_vertex_type)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
               x=v->cx; y=v->cy;
               v->cx = (stbtt_vertex_type)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
               v->cy = (stbtt_vertex_type)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
            }
            // Append vertices.
            tmp = (stbtt_vertex*)STBTT_malloc((num_vertices+comp_num_verts)*sizeof(stbtt_vertex), info->userdata);
            if (!tmp) {
               if (vertices) STBTT_free(vertices, info->userdata);
               if (comp_verts) STBTT_free(comp_verts, info->userdata);
               return 0;
            }
            if (num_vertices > 0) STBTT_memcpy(tmp, vertices, num_vertices*sizeof(stbtt_vertex));
            STBTT_memcpy(tmp+num_vertices, comp_verts, comp_num_verts*sizeof(stbtt_vertex));
            if (vertices) STBTT_free(vertices, info->userdata);
            vertices = tmp;
            STBTT_free(comp_verts, info->userdata);
            num_vertices += comp_num_verts;
         }
         // More components ?
         more = flags & (1<<5);
      }
   } else if (numberOfContours < 0) {
      // @TODO other compound variations?
      STBTT_assert(0);
   } else {
      // numberOfCounters == 0, do nothing
   }

   *pvertices = vertices;
   return num_vertices;
}